

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_functions_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::EliminateDeadFunctionsPass::Process(EliminateDeadFunctionsPass *this)

{
  bool bVar1;
  Status SVar2;
  IRContext *pIVar3;
  Module *pMVar4;
  size_type sVar5;
  reference local_a0;
  iterator local_98;
  undefined1 local_88 [8];
  iterator funcIter;
  anon_class_8_1_105dc18e aStack_70;
  bool modified;
  undefined1 local_68 [8];
  ProcessFunction mark_live;
  unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
  live_function_set;
  EliminateDeadFunctionsPass *this_local;
  
  std::
  unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
  ::unordered_set((unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
                   *)&mark_live._M_invoker);
  aStack_70.live_function_set =
       (unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
        *)&mark_live._M_invoker;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::EliminateDeadFunctionsPass::Process()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_68,&stack0xffffffffffffff90);
  pIVar3 = Pass::context((Pass *)this);
  IRContext::ProcessReachableCallTree(pIVar3,(ProcessFunction *)local_68);
  funcIter.iterator_._M_current._7_1_ = 0;
  pMVar4 = Pass::get_module((Pass *)this);
  _local_88 = Module::begin(pMVar4);
  while( true ) {
    pMVar4 = Pass::get_module((Pass *)this);
    local_98 = Module::end(pMVar4);
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_88,&local_98);
    if (!bVar1) break;
    local_a0 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_88);
    sVar5 = std::
            unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
            ::count((unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
                     *)&mark_live._M_invoker,&local_a0);
    if (sVar5 == 0) {
      funcIter.iterator_._M_current._7_1_ = 1;
      pIVar3 = Pass::context((Pass *)this);
      _local_88 = eliminatedeadfunctionsutil::EliminateFunction(pIVar3,(iterator *)local_88);
    }
    else {
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_88);
    }
  }
  SVar2 = SuccessWithoutChange;
  if ((funcIter.iterator_._M_current._7_1_ & 1) != 0) {
    SVar2 = SuccessWithChange;
  }
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_68);
  std::
  unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
  ::~unordered_set((unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
                    *)&mark_live._M_invoker);
  return SVar2;
}

Assistant:

Pass::Status EliminateDeadFunctionsPass::Process() {
  // Identify live functions first.  Those that are not live
  // are dead.
  std::unordered_set<const Function*> live_function_set;
  ProcessFunction mark_live = [&live_function_set](Function* fp) {
    live_function_set.insert(fp);
    return false;
  };
  context()->ProcessReachableCallTree(mark_live);

  bool modified = false;
  for (auto funcIter = get_module()->begin();
       funcIter != get_module()->end();) {
    if (live_function_set.count(&*funcIter) == 0) {
      modified = true;
      funcIter =
          eliminatedeadfunctionsutil::EliminateFunction(context(), &funcIter);
    } else {
      ++funcIter;
    }
  }

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}